

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::DescriptorTest_FindFieldByNumber_Test::TestBody
          (DescriptorTest_FindFieldByNumber_Test *this)

{
  FieldDescriptor *pFVar1;
  pointer *__ptr;
  char *pcVar2;
  char *in_R9;
  internal iVar3;
  AssertionResult gtest_ar;
  AssertHelper local_58;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  undefined1 local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  AssertHelper local_20;
  
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Descriptor::FindFieldByNumber((this->super_DescriptorTest).message_,1);
  testing::internal::
  CmpHelperEQ<google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*>
            ((internal *)local_40,"foo_","message_->FindFieldByNumber(1)",
             &(this->super_DescriptorTest).foo_,(FieldDescriptor **)&local_50);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar2 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x443,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((FieldDescriptor *)local_50._M_head_impl != (FieldDescriptor *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Descriptor::FindFieldByNumber((this->super_DescriptorTest).message_,6);
  testing::internal::
  CmpHelperEQ<google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*>
            ((internal *)local_40,"bar_","message_->FindFieldByNumber(6)",
             &(this->super_DescriptorTest).bar_,(FieldDescriptor **)&local_50);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar2 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x444,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((FieldDescriptor *)local_50._M_head_impl != (FieldDescriptor *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Descriptor::FindFieldByNumber((this->super_DescriptorTest).message_,500000000);
  testing::internal::
  CmpHelperEQ<google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*>
            ((internal *)local_40,"baz_","message_->FindFieldByNumber(500000000)",
             &(this->super_DescriptorTest).baz_,(FieldDescriptor **)&local_50);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar2 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x445,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((FieldDescriptor *)local_50._M_head_impl != (FieldDescriptor *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Descriptor::FindFieldByNumber((this->super_DescriptorTest).message_,0xf);
  testing::internal::
  CmpHelperEQ<google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*>
            ((internal *)local_40,"moo_","message_->FindFieldByNumber(15)",
             &(this->super_DescriptorTest).moo_,(FieldDescriptor **)&local_50);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar2 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x446,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((FieldDescriptor *)local_50._M_head_impl != (FieldDescriptor *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  pFVar1 = Descriptor::FindFieldByNumber((this->super_DescriptorTest).message_,0xcc7d8);
  iVar3 = (internal)(pFVar1 == (FieldDescriptor *)0x0);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_50._M_head_impl._0_1_ = iVar3;
  if (!(bool)iVar3) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_40,(internal *)&local_50,
               (AssertionResult *)"message_->FindFieldByNumber(837592) == nullptr","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x447,(char *)CONCAT71(local_40._1_7_,local_40[0]));
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_40._1_7_,local_40[0]) != &local_30) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_40._1_7_,local_40[0]),local_30._M_allocated_capacity + 1);
    }
    if (local_58.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_58.data_ + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  pFVar1 = Descriptor::FindFieldByNumber((this->super_DescriptorTest).message_,2);
  local_50._M_head_impl._0_1_ = (internal)(pFVar1 == (FieldDescriptor *)0x0);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (pFVar1 != (FieldDescriptor *)0x0) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_40,(internal *)&local_50,
               (AssertionResult *)"message_->FindFieldByNumber(2) == nullptr","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x448,(char *)CONCAT71(local_40._1_7_,local_40[0]));
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_40._1_7_,local_40[0]) != &local_30) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_40._1_7_,local_40[0]),local_30._M_allocated_capacity + 1);
    }
    if (local_58.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_58.data_ + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Descriptor::FindFieldByNumber((this->super_DescriptorTest).message2_,1);
  testing::internal::
  CmpHelperEQ<google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*>
            ((internal *)local_40,"foo2_","message2_->FindFieldByNumber(1)",
             &(this->super_DescriptorTest).foo2_,(FieldDescriptor **)&local_50);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar2 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x44a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((FieldDescriptor *)local_50._M_head_impl != (FieldDescriptor *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Descriptor::FindFieldByNumber((this->super_DescriptorTest).message2_,2);
  testing::internal::
  CmpHelperEQ<google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*>
            ((internal *)local_40,"bar2_","message2_->FindFieldByNumber(2)",
             &(this->super_DescriptorTest).bar2_,(FieldDescriptor **)&local_50);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar2 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,1099,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((FieldDescriptor *)local_50._M_head_impl != (FieldDescriptor *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  local_50._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Descriptor::FindFieldByNumber((this->super_DescriptorTest).message2_,6);
  testing::internal::
  CmpHelperEQ<google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*>
            ((internal *)local_40,"mooo2_","message2_->FindFieldByNumber(6)",
             &(this->super_DescriptorTest).mooo2_,(FieldDescriptor **)&local_50);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar2 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x44c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    if ((FieldDescriptor *)local_50._M_head_impl != (FieldDescriptor *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  pFVar1 = Descriptor::FindFieldByNumber((this->super_DescriptorTest).message2_,0xf);
  iVar3 = (internal)(pFVar1 == (FieldDescriptor *)0x0);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_50._M_head_impl._0_1_ = iVar3;
  if (!(bool)iVar3) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_40,(internal *)&local_50,
               (AssertionResult *)"message2_->FindFieldByNumber(15) == nullptr","false","true",in_R9
              );
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x44d,(char *)CONCAT71(local_40._1_7_,local_40[0]));
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_40._1_7_,local_40[0]) != &local_30) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_40._1_7_,local_40[0]),local_30._M_allocated_capacity + 1);
    }
    if (local_58.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_58.data_ + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  pFVar1 = Descriptor::FindFieldByNumber((this->super_DescriptorTest).message2_,500000000);
  local_50._M_head_impl._0_1_ = (internal)(pFVar1 == (FieldDescriptor *)0x0);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (pFVar1 != (FieldDescriptor *)0x0) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_40,(internal *)&local_50,
               (AssertionResult *)"message2_->FindFieldByNumber(500000000) == nullptr","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x44e,(char *)CONCAT71(local_40._1_7_,local_40[0]));
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_40._1_7_,local_40[0]) != &local_30) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_40._1_7_,local_40[0]),local_30._M_allocated_capacity + 1);
    }
    if (local_58.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_58.data_ + 8))();
    }
    if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_48,local_48);
    }
  }
  return;
}

Assistant:

TEST_F(DescriptorTest, FindFieldByNumber) {
  EXPECT_EQ(foo_, message_->FindFieldByNumber(1));
  EXPECT_EQ(bar_, message_->FindFieldByNumber(6));
  EXPECT_EQ(baz_, message_->FindFieldByNumber(500000000));
  EXPECT_EQ(moo_, message_->FindFieldByNumber(15));
  EXPECT_TRUE(message_->FindFieldByNumber(837592) == nullptr);
  EXPECT_TRUE(message_->FindFieldByNumber(2) == nullptr);

  EXPECT_EQ(foo2_, message2_->FindFieldByNumber(1));
  EXPECT_EQ(bar2_, message2_->FindFieldByNumber(2));
  EXPECT_EQ(mooo2_, message2_->FindFieldByNumber(6));
  EXPECT_TRUE(message2_->FindFieldByNumber(15) == nullptr);
  EXPECT_TRUE(message2_->FindFieldByNumber(500000000) == nullptr);
}